

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshproxy.c
# Opt level: O0

void try_send_ssh_to_socket(void *ctx)

{
  size_t sVar1;
  ptrlen pVar2;
  char *local_28;
  ptrlen pl;
  SshProxy *sp;
  void *ctx_local;
  
  if ((*(byte *)((long)ctx + 0x2058) & 1) == 0) {
    while (sVar1 = bufchain_size((bufchain *)((long)ctx + 0x2060)), sVar1 != 0) {
      pVar2 = bufchain_prefix((bufchain *)((long)ctx + 0x2060));
      local_28 = (char *)pVar2.ptr;
      pl.ptr = (void *)pVar2.len;
      plug_receive(*(Plug **)((long)ctx + 0x2050),0,local_28,(size_t)pl.ptr);
      bufchain_consume((bufchain *)((long)ctx + 0x2060),(size_t)pl.ptr);
    }
    if (((*(byte *)((long)ctx + 0x2088) & 1) != 0) && ((*(byte *)((long)ctx + 0x2089) & 1) == 0)) {
      *(undefined1 *)((long)ctx + 0x2089) = 1;
      plug_closing_normal(*(Plug **)((long)ctx + 0x2050));
    }
  }
  return;
}

Assistant:

static void try_send_ssh_to_socket(void *ctx)
{
    SshProxy *sp = (SshProxy *)ctx;

    if (sp->frozen)
        return;

    while (bufchain_size(&sp->ssh_to_socket)) {
        ptrlen pl = bufchain_prefix(&sp->ssh_to_socket);
        plug_receive(sp->plug, 0, pl.ptr, pl.len);
        bufchain_consume(&sp->ssh_to_socket, pl.len);
    }

    if (sp->rcvd_eof_ssh_to_socket &&
        !sp->sent_eof_ssh_to_socket) {
        sp->sent_eof_ssh_to_socket = true;
        plug_closing_normal(sp->plug);
    }
}